

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

void __thiscall QListView::setModelColumn(QListView *this,int column)

{
  QAbstractItemViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  char cVar2;
  int iVar3;
  long in_FS_OFFSET;
  QAccessibleTableModelChangeEvent event;
  code *local_68;
  quintptr qStack_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < column) {
    this_00 = *(QAbstractItemViewPrivate **)
               &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
                .field_0x8;
    pQVar1 = this_00->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_68,&this_00->root);
    iVar3 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1);
    if (column < iVar3) {
      *(int *)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
               field_0x50 = column;
      QAbstractItemViewPrivate::doDelayedItemsLayout(this_00,0);
      cVar2 = QAccessible::isActive();
      if (cVar2 != '\0') {
        uStack_50 = 0xffffffff;
        local_68 = QIcon::QIcon;
        local_48 = 0xffffffff;
        uStack_44 = 0xffffffff;
        uStack_40 = 0xffffffff;
        uStack_3c = 0xffffffff;
        qStack_60 = 0xaaaaaaaa00000116;
        local_58.ptr = (QAbstractItemModel *)this;
        QAccessible::updateAccessibility((QAccessibleEvent *)&local_68);
        QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent
                  ((QAccessibleTableModelChangeEvent *)&local_68);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListView::setModelColumn(int column)
{
    Q_D(QListView);
    if (column < 0 || column >= d->model->columnCount(d->root))
        return;
    d->column = column;
    d->doDelayedItemsLayout();
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        QAccessibleTableModelChangeEvent event(this, QAccessibleTableModelChangeEvent::ModelReset);
        QAccessible::updateAccessibility(&event);
    }
#endif
}